

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O3

void run_negation_range_test7(void)

{
  _Bool unaff_retaddr;
  
  run_negation_range_tests(1000,2,0x226,0,3,0,false,unaff_retaddr);
  return;
}

Assistant:

DEFINE_TEST(run_negation_range_test7) {
    // short runs of length 2, 3, .. 67 begin every
    // 1000 starting at 550.
    // last run starts at 65550 hence we end in a
    // run.
    // negation over whole range.  Result should be
    // run.
    // should always fit in the previous space

    run_negation_range_tests(1000, 2, 550, 0x0000, 0x10000, RUN_CONTAINER_TYPE,
                             false, false);
}